

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int convertCompoundSelectToSubquery(Walker *pWalker,Select *p)

{
  long lVar1;
  IdList *pUsing;
  SrcList *pSVar2;
  ExprList *pEVar3;
  Expr *in_RSI;
  undefined8 *in_RDI;
  Token dummy;
  Parse *pParse;
  SrcList *pNewSrc;
  ExprList_item *a;
  sqlite3 *db;
  Select *pX;
  Select *pNew;
  int i;
  u64 in_stack_ffffffffffffff78;
  sqlite3 *in_stack_ffffffffffffff80;
  char *zToken;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  Select *in_stack_ffffffffffffff90;
  sqlite3 *db_00;
  undefined6 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9e;
  undefined1 uVar4;
  Token *in_stack_ffffffffffffffa0;
  Token *in_stack_ffffffffffffffa8;
  Parse *in_stack_ffffffffffffffb8;
  Expr *pOn;
  int local_1c;
  int local_4;
  
  if (in_RSI[1].u.zToken == (char *)0x0) {
    local_4 = 0;
  }
  else {
    lVar1._0_1_ = in_RSI[1].op;
    lVar1._1_1_ = in_RSI[1].affinity;
    lVar1._2_2_ = *(undefined2 *)&in_RSI[1].field_0x2;
    lVar1._4_4_ = in_RSI[1].flags;
    pOn = in_RSI;
    if (lVar1 == 0) {
      local_4 = 0;
    }
    else {
      while( true ) {
        uVar4 = false;
        if ((pOn != (Expr *)0x0) &&
           (in_stack_ffffffffffffff9e = true, uVar4 = in_stack_ffffffffffffff9e,
           *(char *)&pOn->u != '|')) {
          in_stack_ffffffffffffff9e = *(char *)&pOn->u == '\x7f';
          uVar4 = in_stack_ffffffffffffff9e;
        }
        if ((bool)uVar4 == false) break;
        pOn = (Expr *)pOn[1].u.zToken;
      }
      if (pOn == (Expr *)0x0) {
        local_4 = 0;
      }
      else {
        local_1c = **(int **)(in_RSI + 1);
        do {
          local_1c = local_1c + -1;
          if (local_1c < 0) break;
        } while ((*(uint *)(*(long *)(*(long *)(in_RSI + 1) + 8 + (long)local_1c * 0x20) + 4) &
                 0x100) == 0);
        if (local_1c < 0) {
          local_4 = 0;
        }
        else {
          db_00 = (sqlite3 *)*in_RDI;
          pUsing = (IdList *)
                   sqlite3DbMallocZero(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
          if (pUsing == (IdList *)0x0) {
            local_4 = 2;
          }
          else {
            memset(&stack0xffffffffffffffa0,0,0x10);
            zToken = (char *)0x0;
            pSVar2 = sqlite3SrcListAppendFromTerm
                               (in_stack_ffffffffffffffb8,(SrcList *)db_00,in_stack_ffffffffffffffa8
                                ,in_stack_ffffffffffffffa0,
                                (Token *)CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffff9e,
                                                                 in_stack_ffffffffffffff98)),
                                in_stack_ffffffffffffff90,pOn,pUsing);
            if (pSVar2 == (SrcList *)0x0) {
              local_4 = 2;
            }
            else {
              memcpy(pUsing,in_RSI,0x80);
              *(SrcList **)&in_RSI->nHeight = pSVar2;
              sqlite3Expr(db_00,in_stack_ffffffffffffff8c,zToken);
              pEVar3 = sqlite3ExprListAppend
                                 ((Parse *)CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffff9e,
                                                                   in_stack_ffffffffffffff98)),
                                  (ExprList *)db_00,
                                  (Expr *)CONCAT44(in_stack_ffffffffffffff8c,
                                                   in_stack_ffffffffffffff88));
              *(ExprList **)in_RSI = pEVar3;
              *(undefined1 *)&in_RSI->u = 0x7f;
              in_RSI->iColumn = 0;
              in_RSI->iAgg = 0;
              in_RSI->iRightJoinTable = 0;
              in_RSI->op2 = '\0';
              in_RSI->field_0x37 = 0;
              *(undefined8 *)&pUsing[3].nId = 0;
              pUsing[4].a = (IdList_item *)0x0;
              *(undefined8 *)&pUsing[4].nId = 0;
              in_RSI[1].u.zToken = (char *)0x0;
              in_RSI[1].pLeft = (Expr *)0x0;
              in_RSI[1].x.pList = (ExprList *)0x0;
              *(uint *)((long)&in_RSI->u + 4) = *(uint *)((long)&in_RSI->u + 4) & 0xfffffeff;
              *(uint *)((long)&in_RSI->u + 4) = *(uint *)((long)&in_RSI->u + 4) | 0x10000;
              *(IdList **)&pUsing[5].a[5].idx = pUsing;
              pUsing[6].a = (IdList_item *)0x0;
              local_4 = 0;
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

static int convertCompoundSelectToSubquery(Walker *pWalker, Select *p){
  int i;
  Select *pNew;
  Select *pX;
  sqlite3 *db;
  struct ExprList_item *a;
  SrcList *pNewSrc;
  Parse *pParse;
  Token dummy;

  if( p->pPrior==0 ) return WRC_Continue;
  if( p->pOrderBy==0 ) return WRC_Continue;
  for(pX=p; pX && (pX->op==TK_ALL || pX->op==TK_SELECT); pX=pX->pPrior){}
  if( pX==0 ) return WRC_Continue;
  a = p->pOrderBy->a;
  for(i=p->pOrderBy->nExpr-1; i>=0; i--){
    if( a[i].pExpr->flags & EP_Collate ) break;
  }
  if( i<0 ) return WRC_Continue;

  /* If we reach this point, that means the transformation is required. */

  pParse = pWalker->pParse;
  db = pParse->db;
  pNew = sqlite3DbMallocZero(db, sizeof(*pNew) );
  if( pNew==0 ) return WRC_Abort;
  memset(&dummy, 0, sizeof(dummy));
  pNewSrc = sqlite3SrcListAppendFromTerm(pParse,0,0,0,&dummy,pNew,0,0);
  if( pNewSrc==0 ) return WRC_Abort;
  *pNew = *p;
  p->pSrc = pNewSrc;
  p->pEList = sqlite3ExprListAppend(pParse, 0, sqlite3Expr(db, TK_ASTERISK, 0));
  p->op = TK_SELECT;
  p->pWhere = 0;
  pNew->pGroupBy = 0;
  pNew->pHaving = 0;
  pNew->pOrderBy = 0;
  p->pPrior = 0;
  p->pNext = 0;
  p->pWith = 0;
  p->selFlags &= ~SF_Compound;
  assert( (p->selFlags & SF_Converted)==0 );
  p->selFlags |= SF_Converted;
  assert( pNew->pPrior!=0 );
  pNew->pPrior->pNext = pNew;
  pNew->pLimit = 0;
  return WRC_Continue;
}